

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<4> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::avx::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::avx::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                *current,CachedAllocator alloc,bool toplevel)

{
  PrimInfoExtRange *pPVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  Vec3fa VVar4;
  byte bVar5;
  undefined4 uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  iterator __position;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  char cVar14;
  size_t i_1;
  long *plVar15;
  ThreadLocal2 *pTVar16;
  ulong uVar17;
  NodeRefPtr<4> NVar18;
  ThreadLocal2 *pTVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar20;
  size_t sVar21;
  runtime_error *this_00;
  unsigned_long *puVar22;
  ThreadLocal2 *pTVar23;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *current_00;
  size_t i_2;
  AABBNode_t<embree::NodeRefPtr<4>,_4> *node;
  ulong uVar24;
  char *pcVar25;
  float fVar26;
  undefined1 auVar27 [32];
  NodeRefPtr<4> values [16];
  Split split_1;
  Split split;
  Lock<embree::MutexSys> lock;
  PrimInfoExtRange rprims;
  PrimInfoExtRange lprims;
  auto_partitioner local_a89;
  anon_class_24_3_c379faaa local_a88;
  NodeRefPtr<4> local_a70;
  bool local_a68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a60;
  undefined1 local_a50 [16];
  undefined4 local_a40;
  undefined4 uStack_a3c;
  undefined4 uStack_a38;
  undefined4 uStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  unsigned_long local_a10;
  undefined1 local_9f0 [8];
  unsigned_long local_9e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_9e0;
  undefined1 local_9d0 [16];
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  unsigned_long local_990;
  task_group_context local_980;
  anon_class_8_1_898bcfc2_conflict local_8c8;
  Split local_8c0;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_840;
  size_t local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_140;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e0;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  unsigned_long local_a0;
  unsigned_long uStack_98;
  unsigned_long local_90;
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc->super_Create).allocator;
    plVar15 = (long *)__tls_get_addr(&PTR_021a7d38);
    pTVar16 = (ThreadLocal2 *)*plVar15;
    if (pTVar16 == (ThreadLocal2 *)0x0) {
      pTVar16 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)pTVar16);
      (pTVar16->alloc)._M_b._M_p = (__pointer_type)0x0;
      (pTVar16->alloc0).parent = pTVar16;
      auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar16->alloc0).ptr = (char *)auVar27._0_8_;
      (pTVar16->alloc0).cur = auVar27._8_8_;
      (pTVar16->alloc0).end = auVar27._16_8_;
      (pTVar16->alloc0).allocBlockSize = auVar27._24_8_;
      (pTVar16->alloc0).end = auVar27._0_8_;
      (pTVar16->alloc0).allocBlockSize = auVar27._8_8_;
      (pTVar16->alloc0).bytesUsed = auVar27._16_8_;
      (pTVar16->alloc0).bytesWasted = auVar27._24_8_;
      (pTVar16->alloc1).parent = pTVar16;
      auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar16->alloc1).ptr = (char *)auVar27._0_8_;
      (pTVar16->alloc1).cur = auVar27._8_8_;
      (pTVar16->alloc1).end = auVar27._16_8_;
      (pTVar16->alloc1).allocBlockSize = auVar27._24_8_;
      (pTVar16->alloc1).end = auVar27._0_8_;
      (pTVar16->alloc1).allocBlockSize = auVar27._8_8_;
      (pTVar16->alloc1).bytesUsed = auVar27._16_8_;
      (pTVar16->alloc1).bytesWasted = auVar27._24_8_;
      *plVar15 = (long)pTVar16;
      local_840.depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      local_840.alloc_barrier = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_980.my_cpu_ctl_env = (uint64_t)pTVar16;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_980);
      if ((ThreadLocal2 *)local_980.my_cpu_ctl_env != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_980,
                   (ThreadLocal2 *)local_980.my_cpu_ctl_env);
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    }
    alloc.talloc0 = &pTVar16->alloc0;
    alloc.talloc1 = &pTVar16->alloc1;
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  pPVar1 = &current->prims;
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
            (&local_8c0,this->heuristic,pPVar1,(this->cfg).logBlockSize);
  bVar5 = (byte)(this->cfg).logBlockSize;
  uVar7 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  uVar8 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin;
  uVar17 = uVar7 - uVar8;
  if ((uVar17 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_012d5116:
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    deterministic_order(this->heuristic,pPVar1);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    NVar18 = createLargeLeaf(this,current,alloc_00);
    return (NodeRefPtr<4>)NVar18.ptr;
  }
  if (uVar17 <= (this->cfg).maxLeafSize) {
    auVar13 = vsubps_avx((undefined1  [16])
                         (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0,
                         (undefined1  [16])
                         (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0);
    auVar11 = vmovshdup_avx(auVar13);
    auVar12 = vshufpd_avx(auVar13,auVar13,1);
    fVar10 = auVar13._0_4_ * (auVar11._0_4_ + auVar12._0_4_) + auVar11._0_4_ * auVar12._0_4_;
    fVar26 = (this->cfg).intCost;
    if (fVar26 * fVar10 * (float)((~(-1L << (bVar5 & 0x3f)) + uVar7) - uVar8 >> (bVar5 & 0x3f)) <=
        fVar10 * (this->cfg).travCost + fVar26 * local_8c0.sah) goto LAB_012d5116;
  }
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::split
            (this->heuristic,&local_8c0,pPVar1,(PrimInfoExtRange *)&local_e0.field_1,
             (PrimInfoExtRange *)&local_140.field_1);
  local_840.depth = current->depth + 1;
  local_840.alloc_barrier = false;
  local_840.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = local_e0._0_8_;
  local_840.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = local_e0._8_8_;
  local_840.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = uStack_d0;
  local_840.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = uStack_c8;
  local_840.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = local_c0;
  local_840.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = uStack_b8;
  local_840.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = uStack_b0;
  local_840.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = uStack_a8;
  local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = local_a0;
  local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = uStack_98;
  local_840.prims.super_extended_range<unsigned_long>._ext_end = local_90;
  local_7d0 = local_840.depth;
  local_7c8 = 0;
  local_7c0 = local_140._0_8_;
  uStack_7b8 = local_140._8_8_;
  uStack_7b0 = uStack_130;
  uStack_7a8 = uStack_128;
  local_7a0 = local_120;
  local_780 = local_100;
  uStack_778 = uStack_f8;
  local_770 = local_f0;
  pTVar16 = (ThreadLocal2 *)0x2;
  if (2 < (this->cfg).branchingFactor) {
    do {
      pTVar19 = (ThreadLocal2 *)0xffffffffffffffff;
      puVar22 = &local_840.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
      ;
      fVar26 = -INFINITY;
      pTVar23 = (ThreadLocal2 *)0x0;
      do {
        if ((this->cfg).minLeafSize < *puVar22 - ((range<unsigned_long> *)(puVar22 + -1))->_begin) {
          auVar13 = vsubps_avx(*(undefined1 (*) [16])(puVar22 + -7),
                               *(undefined1 (*) [16])(puVar22 + -9));
          auVar11 = vmovshdup_avx(auVar13);
          auVar12 = vshufpd_avx(auVar13,auVar13,1);
          fVar10 = auVar13._0_4_ * (auVar11._0_4_ + auVar12._0_4_) + auVar11._0_4_ * auVar12._0_4_;
          if (fVar26 < fVar10) {
            pTVar19 = pTVar23;
            fVar26 = fVar10;
          }
        }
        pTVar23 = (ThreadLocal2 *)((long)&(pTVar23->mutex).mutex + 1);
        puVar22 = puVar22 + 0xe;
      } while (pTVar16 != pTVar23);
      if (pTVar19 == (ThreadLocal2 *)0xffffffffffffffff) break;
      local_a70.ptr = current->depth + 1;
      local_a68 = false;
      local_a60.m128[0] = INFINITY;
      local_a60.m128[1] = INFINITY;
      local_a60.m128[2] = INFINITY;
      local_a60.m128[3] = INFINITY;
      local_a50._8_4_ = 0xff800000;
      local_a50._0_8_ = 0xff800000ff800000;
      local_a50._12_4_ = 0xff800000;
      local_a40 = 0x7f800000;
      uStack_a3c = 0x7f800000;
      uStack_a38 = 0x7f800000;
      uStack_a34 = 0x7f800000;
      local_a10 = 0;
      local_a20 = ZEXT816(0) << 0x40;
      local_9e8 = local_9e8 & 0xffffffffffffff00;
      local_9e0._0_8_ = 0x7f8000007f800000;
      local_9e0.m128[2] = INFINITY;
      local_9e0.m128[3] = INFINITY;
      local_9c0 = 0x7f800000;
      uStack_9bc = 0x7f800000;
      uStack_9b8 = 0x7f800000;
      uStack_9b4 = 0x7f800000;
      local_990 = 0;
      pPVar1 = &(&local_840)[(long)pTVar19].prims;
      local_a30 = local_a50;
      local_9f0 = (undefined1  [8])local_a70.ptr;
      local_9d0 = local_a50;
      local_9b0 = local_a50;
      local_9a0 = local_a20;
      HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
      find((Split *)&local_980,this->heuristic,pPVar1,(this->cfg).logBlockSize);
      HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
      split(this->heuristic,(Split *)&local_980,pPVar1,(PrimInfoExtRange *)&local_a60.field_1,
            (PrimInfoExtRange *)&local_9e0.field_1);
      (&local_840)[(long)pTVar19].alloc_barrier = local_a68;
      (&local_840)[(long)pTVar19].depth = local_a70.ptr;
      *(ulong *)&(pPVar1->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
           CONCAT44(local_a60.m128[1],local_a60.m128[0]);
      *(ulong *)((long)&(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.geomBounds.lower.
                        field_0 + 8) = CONCAT44(local_a60.m128[3],local_a60.m128[2]);
      *(undefined8 *)
       &(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
           local_a50._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8)
           = local_a50._8_8_;
      *(ulong *)&(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
           CONCAT44(uStack_a3c,local_a40);
      *(ulong *)((long)&(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.centBounds.lower.
                        field_0 + 8) = CONCAT44(uStack_a34,uStack_a38);
      *(undefined8 *)
       &(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
           local_a30._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pTVar19].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8)
           = local_a30._8_8_;
      (&local_840)[(long)pTVar19].prims.super_extended_range<unsigned_long>._ext_end = local_a10;
      (&local_840)[(long)pTVar19].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._begin = local_a20._0_8_;
      (&local_840)[(long)pTVar19].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._end = local_a20._8_8_;
      (&local_840)[(long)pTVar16].depth = (size_t)local_9f0;
      (&local_840)[(long)pTVar16].alloc_barrier = local_9e8._0_1_;
      *(undefined8 *)
       &(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
           local_9e0._0_8_;
      *(ulong *)((long)&(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.geomBounds.lower.
                        field_0 + 8) = CONCAT44(local_9e0.m128[3],local_9e0.m128[2]);
      *(undefined8 *)
       &(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
           local_9d0._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8)
           = local_9d0._8_8_;
      *(ulong *)&(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
           CONCAT44(uStack_9bc,local_9c0);
      *(ulong *)((long)&(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.centBounds.lower.
                        field_0 + 8) = CONCAT44(uStack_9b4,uStack_9b8);
      *(undefined8 *)
       &(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
           local_9b0._0_8_;
      *(undefined8 *)
       ((long)&(&local_840)[(long)pTVar16].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8)
           = local_9b0._8_8_;
      (&local_840)[(long)pTVar16].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._begin = local_9a0._0_8_;
      (&local_840)[(long)pTVar16].prims.super_extended_range<unsigned_long>.
      super_range<unsigned_long>._end = local_9a0._8_8_;
      (&local_840)[(long)pTVar16].prims.super_extended_range<unsigned_long>._ext_end = local_990;
      pTVar16 = (ThreadLocal2 *)((long)&(pTVar16->mutex).mutex + 1);
    } while (pTVar16 < (ThreadLocal2 *)(this->cfg).branchingFactor);
  }
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<4>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::avx::CreateLeafSpatial<4,embree::TriangleMv<4>>>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::recurse();
  }
  lVar9 = 0x3f;
  if (pTVar16 != (ThreadLocal2 *)0x0) {
    for (; (ulong)pTVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
    }
  }
  current_00 = &local_840;
  std::
  __introsort_loop<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>>>>
            (current_00,&(&local_840)[(long)pTVar16].depth,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
  std::
  __final_insertion_sort<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>>>>
            (current_00,&(&local_840)[(long)pTVar16].depth);
  local_a88.values = (NodeRefPtr<4> (*) [16])0x80;
  pTVar19 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar19->alloc)._M_b._M_p) {
    local_a68 = true;
    local_a70.ptr = (size_t)pTVar19;
    MutexSys::lock(&pTVar19->mutex);
    if ((pTVar19->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar19->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar19->alloc1).bytesUsed + (pTVar19->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar19->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar19->alloc0).end + (pTVar19->alloc1).end) -
           ((pTVar19->alloc0).cur + (pTVar19->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar19->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar19->alloc1).bytesWasted + (pTVar19->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar19->alloc0).end = auVar27._0_8_;
    (pTVar19->alloc0).allocBlockSize = auVar27._8_8_;
    (pTVar19->alloc0).bytesUsed = auVar27._16_8_;
    (pTVar19->alloc0).bytesWasted = auVar27._24_8_;
    (pTVar19->alloc0).ptr = (char *)auVar27._0_8_;
    (pTVar19->alloc0).cur = auVar27._8_8_;
    (pTVar19->alloc0).end = auVar27._16_8_;
    (pTVar19->alloc0).allocBlockSize = auVar27._24_8_;
    auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar19->alloc1).end = auVar27._0_8_;
      (pTVar19->alloc1).allocBlockSize = auVar27._8_8_;
      (pTVar19->alloc1).bytesUsed = auVar27._16_8_;
      (pTVar19->alloc1).bytesWasted = auVar27._24_8_;
      (pTVar19->alloc1).ptr = (char *)auVar27._0_8_;
      (pTVar19->alloc1).cur = auVar27._8_8_;
      (pTVar19->alloc1).end = auVar27._16_8_;
      (pTVar19->alloc1).allocBlockSize = auVar27._24_8_;
    }
    else {
      (pTVar19->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar19->alloc1).ptr = (char *)auVar27._0_8_;
      (pTVar19->alloc1).cur = auVar27._8_8_;
      (pTVar19->alloc1).end = auVar27._16_8_;
      (pTVar19->alloc1).allocBlockSize = auVar27._24_8_;
      (pTVar19->alloc1).end = auVar27._0_8_;
      (pTVar19->alloc1).allocBlockSize = auVar27._8_8_;
      (pTVar19->alloc1).bytesUsed = auVar27._16_8_;
      (pTVar19->alloc1).bytesWasted = auVar27._24_8_;
      (pTVar19->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar19->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_980.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
    local_980.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    local_9f0 = (undefined1  [8])pTVar19;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,(ThreadLocal2 **)local_9f0);
      if (((byte)local_980.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i & 1) !=
          0) goto LAB_012d5620;
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_9f0;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
LAB_012d5620:
      MutexSys::unlock((MutexSys *)local_980.my_cpu_ctl_env);
    }
    if (local_a68 == true) {
      MutexSys::unlock((MutexSys *)local_a70.ptr);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (long)&((MutexSys *)*local_a88.values)->mutex + (alloc.talloc0)->bytesUsed;
  sVar21 = (alloc.talloc0)->cur;
  uVar17 = (ulong)(-(int)sVar21 & 0xf);
  uVar24 = (long)&((MutexSys *)*local_a88.values)->mutex + uVar17 + sVar21;
  (alloc.talloc0)->cur = uVar24;
  if ((alloc.talloc0)->end < uVar24) {
    (alloc.talloc0)->cur = sVar21;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize <
        (ThreadLocal2 *)((long)local_a88.values << 2)) {
      pcVar25 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_a88);
    }
    else {
      local_980.my_cpu_ctl_env = (uint64_t)(alloc.talloc0)->allocBlockSize;
      pcVar25 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_980);
      (alloc.talloc0)->ptr = pcVar25;
      sVar21 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar21;
      (alloc.talloc0)->end = local_980.my_cpu_ctl_env;
      (alloc.talloc0)->cur = (size_t)local_a88.values;
      if (local_980.my_cpu_ctl_env < local_a88.values) {
        (alloc.talloc0)->cur = 0;
        local_980.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar25 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_980);
        (alloc.talloc0)->ptr = pcVar25;
        sVar21 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar21;
        (alloc.talloc0)->end = local_980.my_cpu_ctl_env;
        (alloc.talloc0)->cur = (size_t)local_a88.values;
        if (local_980.my_cpu_ctl_env < local_a88.values) {
          (alloc.talloc0)->cur = 0;
          pcVar25 = (char *)0x0;
          goto LAB_012d5672;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar21;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar17;
    pcVar25 = (alloc.talloc0)->ptr + (uVar24 - (long)local_a88.values);
  }
LAB_012d5672:
  pcVar25[0x60] = '\0';
  pcVar25[0x61] = '\0';
  pcVar25[0x62] = -0x80;
  pcVar25[99] = '\x7f';
  pcVar25[100] = '\0';
  pcVar25[0x65] = '\0';
  pcVar25[0x66] = -0x80;
  pcVar25[0x67] = '\x7f';
  pcVar25[0x68] = '\0';
  pcVar25[0x69] = '\0';
  pcVar25[0x6a] = -0x80;
  pcVar25[0x6b] = '\x7f';
  pcVar25[0x6c] = '\0';
  pcVar25[0x6d] = '\0';
  pcVar25[0x6e] = -0x80;
  pcVar25[0x6f] = '\x7f';
  pcVar25[0x40] = '\0';
  pcVar25[0x41] = '\0';
  pcVar25[0x42] = -0x80;
  pcVar25[0x43] = '\x7f';
  pcVar25[0x44] = '\0';
  pcVar25[0x45] = '\0';
  pcVar25[0x46] = -0x80;
  pcVar25[0x47] = '\x7f';
  pcVar25[0x48] = '\0';
  pcVar25[0x49] = '\0';
  pcVar25[0x4a] = -0x80;
  pcVar25[0x4b] = '\x7f';
  pcVar25[0x4c] = '\0';
  pcVar25[0x4d] = '\0';
  pcVar25[0x4e] = -0x80;
  pcVar25[0x4f] = '\x7f';
  pcVar25[0x20] = '\0';
  pcVar25[0x21] = '\0';
  pcVar25[0x22] = -0x80;
  pcVar25[0x23] = '\x7f';
  pcVar25[0x24] = '\0';
  pcVar25[0x25] = '\0';
  pcVar25[0x26] = -0x80;
  pcVar25[0x27] = '\x7f';
  pcVar25[0x28] = '\0';
  pcVar25[0x29] = '\0';
  pcVar25[0x2a] = -0x80;
  pcVar25[0x2b] = '\x7f';
  pcVar25[0x2c] = '\0';
  pcVar25[0x2d] = '\0';
  pcVar25[0x2e] = -0x80;
  pcVar25[0x2f] = '\x7f';
  pcVar25[0x70] = '\0';
  pcVar25[0x71] = '\0';
  pcVar25[0x72] = -0x80;
  pcVar25[0x73] = -1;
  pcVar25[0x74] = '\0';
  pcVar25[0x75] = '\0';
  pcVar25[0x76] = -0x80;
  pcVar25[0x77] = -1;
  pcVar25[0x78] = '\0';
  pcVar25[0x79] = '\0';
  pcVar25[0x7a] = -0x80;
  pcVar25[0x7b] = -1;
  pcVar25[0x7c] = '\0';
  pcVar25[0x7d] = '\0';
  pcVar25[0x7e] = -0x80;
  pcVar25[0x7f] = -1;
  pcVar25[0x50] = '\0';
  pcVar25[0x51] = '\0';
  pcVar25[0x52] = -0x80;
  pcVar25[0x53] = -1;
  pcVar25[0x54] = '\0';
  pcVar25[0x55] = '\0';
  pcVar25[0x56] = -0x80;
  pcVar25[0x57] = -1;
  pcVar25[0x58] = '\0';
  pcVar25[0x59] = '\0';
  pcVar25[0x5a] = -0x80;
  pcVar25[0x5b] = -1;
  pcVar25[0x5c] = '\0';
  pcVar25[0x5d] = '\0';
  pcVar25[0x5e] = -0x80;
  pcVar25[0x5f] = -1;
  pcVar25[0x30] = '\0';
  pcVar25[0x31] = '\0';
  pcVar25[0x32] = -0x80;
  pcVar25[0x33] = -1;
  pcVar25[0x34] = '\0';
  pcVar25[0x35] = '\0';
  pcVar25[0x36] = -0x80;
  pcVar25[0x37] = -1;
  pcVar25[0x38] = '\0';
  pcVar25[0x39] = '\0';
  pcVar25[0x3a] = -0x80;
  pcVar25[0x3b] = -1;
  pcVar25[0x3c] = '\0';
  pcVar25[0x3d] = '\0';
  pcVar25[0x3e] = -0x80;
  pcVar25[0x3f] = -1;
  pcVar25[0] = '\b';
  pcVar25[1] = '\0';
  pcVar25[2] = '\0';
  pcVar25[3] = '\0';
  pcVar25[4] = '\0';
  pcVar25[5] = '\0';
  pcVar25[6] = '\0';
  pcVar25[7] = '\0';
  pcVar25[8] = '\b';
  pcVar25[9] = '\0';
  pcVar25[10] = '\0';
  pcVar25[0xb] = '\0';
  pcVar25[0xc] = '\0';
  pcVar25[0xd] = '\0';
  pcVar25[0xe] = '\0';
  pcVar25[0xf] = '\0';
  pcVar25[0x10] = '\b';
  pcVar25[0x11] = '\0';
  pcVar25[0x12] = '\0';
  pcVar25[0x13] = '\0';
  pcVar25[0x14] = '\0';
  pcVar25[0x15] = '\0';
  pcVar25[0x16] = '\0';
  pcVar25[0x17] = '\0';
  pcVar25[0x18] = '\b';
  pcVar25[0x19] = '\0';
  pcVar25[0x1a] = '\0';
  pcVar25[0x1b] = '\0';
  pcVar25[0x1c] = '\0';
  pcVar25[0x1d] = '\0';
  pcVar25[0x1e] = '\0';
  pcVar25[0x1f] = '\0';
  paVar20 = &local_840.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
  pTVar19 = (ThreadLocal2 *)0x0;
  do {
    auVar11 = *(undefined1 (*) [16])paVar20[-1].m128;
    VVar4.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar20->m128;
    *(int *)(pcVar25 + (long)pTVar19 * 4 + 0x20) = auVar11._0_4_;
    uVar6 = vextractps_avx(auVar11,1);
    *(undefined4 *)(pcVar25 + (long)pTVar19 * 4 + 0x40) = uVar6;
    uVar6 = vextractps_avx(auVar11,2);
    *(undefined4 *)(pcVar25 + (long)pTVar19 * 4 + 0x60) = uVar6;
    *(int *)(pcVar25 + (long)pTVar19 * 4 + 0x30) = VVar4.field_0._0_4_;
    uVar6 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
    *(undefined4 *)(pcVar25 + (long)pTVar19 * 4 + 0x50) = uVar6;
    uVar6 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
    *(undefined4 *)(pcVar25 + (long)pTVar19 * 4 + 0x70) = uVar6;
    pTVar19 = (ThreadLocal2 *)((long)&(pTVar19->mutex).mutex + 1);
    paVar20 = paVar20 + 7;
  } while (pTVar16 != pTVar19);
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    local_a88.values = (NodeRefPtr<4> (*) [16])&local_a70;
    local_a88.children =
         (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
          (*) [16])&local_840;
    local_980.my_version = proxy_support;
    local_980.my_traits = (context_traits)0x4;
    local_980.my_node = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_980.my_name = CUSTOM_CTX;
    local_a88.this =
         (BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleM<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize(&local_980);
    local_9e8 = 0;
    local_9e0._0_8_ = 1;
    local_9f0 = (undefined1  [8])pTVar16;
    local_8c8.func = &local_a88;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)local_9f0,&local_8c8,&local_a89,&local_980);
    cVar14 = tbb::detail::r1::is_group_execution_cancelled(&local_980);
    if (cVar14 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_980);
    pTVar19 = (ThreadLocal2 *)0x0;
    do {
      *(size_t *)(pcVar25 + (long)pTVar19 * 8) = (&local_a70)[(long)pTVar19].ptr;
      pTVar19 = (ThreadLocal2 *)((long)&(pTVar19->mutex).mutex + 1);
    } while (pTVar16 != pTVar19);
  }
  else {
    pTVar19 = (ThreadLocal2 *)0x0;
    do {
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      NVar18 = recurse(this,current_00,alloc_01,false);
      (&local_a70)[(long)pTVar19].ptr = NVar18.ptr;
      pTVar19 = (ThreadLocal2 *)((long)&(pTVar19->mutex).mutex + 1);
      current_00 = current_00 + 1;
    } while (pTVar16 != pTVar19);
    pTVar19 = (ThreadLocal2 *)0x0;
    do {
      *(size_t *)(pcVar25 + (long)pTVar19 * 8) = (&local_a70)[(long)pTVar19].ptr;
      pTVar19 = (ThreadLocal2 *)((long)&(pTVar19->mutex).mutex + 1);
    } while (pTVar16 != pTVar19);
  }
  return (NodeRefPtr<4>)(size_t)pcVar25;
}

Assistant:

const ReductionTy recurse(BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            auto split = heuristic.find(current.prims,cfg.logBlockSize);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*halfArea(current.prims.geomBounds)+cfg.intCost*split.splitSAH();
            assert((current.prims.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.prims.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.prims.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              heuristic.deterministic_order(current.prims);
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            Set lprims,rprims;
            heuristic.split(split,current.prims,lprims,rprims);
	    
            /*! initialize child list with initial split */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            children[0] = BuildRecord(current.depth+1,lprims);
            children[1] = BuildRecord(current.depth+1,rprims);
            size_t numChildren = 2;

            /*! split until node is full or SAH tells us to stop */
            while (numChildren < cfg.branchingFactor)
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.minLeafSize) continue;

                /* find child with largest surface area */
                if (halfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i;
                  bestArea = halfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              auto split = heuristic.find(brecord.prims,cfg.logBlockSize);
              heuristic.split(split,brecord.prims,lrecord.prims,rrecord.prims);
              children[bestChild  ] = lrecord;
              children[numChildren] = rrecord;
              numChildren++;
            }

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* sort buildrecords for faster shadow ray traversal */
            std::sort(&children[0],&children[numChildren],std::greater<BuildRecord>());

            /*! create an inner node */
            auto node = createNode(children,numChildren,alloc);

            /* spawn tasks */
            if (current.size() > cfg.singleThreadThreshold)
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) { // FIXME: no range here
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              return updateNode(current,children,node,values,numChildren);
            }
            /* recurse into each child */
            else
            {
              for (size_t i=0; i<numChildren; i++)
                values[i] = recurse(children[i],alloc,false);

              return updateNode(current,children,node,values,numChildren);
            }
          }